

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmResourceInfoCommon.h
# Opt level: O0

uint64_t __thiscall
GmmLib::GmmResourceInfoCommon::GetDriverProtectionBits
          (GmmResourceInfoCommon *this,GMM_OVERRIDE_VALUES OverrideData)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SKU_FEATURE_TABLE *pSVar3;
  undefined4 extraout_var_01;
  GMM_CACHE_POLICY *pGVar4;
  byte local_35;
  GMM_RESOURCE_USAGE_TYPE local_34;
  bool IscompressionEn;
  int *piStack_30;
  GMM_RESOURCE_USAGE_TYPE Usage;
  GMM_PLATFORM_INFO *pPlatform;
  GMM_DRIVERPROTECTION DriverProtection;
  GmmResourceInfoCommon *this_local;
  GMM_OVERRIDE_VALUES OverrideData_local;
  
  DriverProtection = (GMM_DRIVERPROTECTION)this;
  this_local = (GmmResourceInfoCommon *)OverrideData;
  memset(&pPlatform,0,8);
  iVar1 = (*this->pClientContext->_vptr_GmmClientContext[0x10])();
  piStack_30 = (int *)CONCAT44(extraout_var,iVar1);
  if (*piStack_30 < 0x4f7) {
    OverrideData_local.Usage = 0;
    OverrideData_local.CompressionDis = '\0';
    OverrideData_local._5_3_ = 0;
  }
  else {
    local_34 = (this->Surf).CachePolicy.Usage;
    if (((GMM_RESOURCE_USAGE_TYPE)this_local != GMM_RESOURCE_USAGE_UNKNOWN) &&
       ((GMM_RESOURCE_USAGE_TYPE)this_local < GMM_RESOURCE_USAGE_MAX)) {
      local_34 = (GMM_RESOURCE_USAGE_TYPE)this_local;
    }
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pSVar3 = Context::GetSkuTable((Context *)CONCAT44(extraout_var_00,iVar1));
    if (((ulong)pSVar3->field_1 >> 0x22 & 1) != 0) {
      if (this_local._4_1_ == '\0') {
        pPlatform = (GMM_PLATFORM_INFO *)
                    ((ulong)pPlatform & 0xffffffff7fffffff |
                    (ulong)(((ulong)(this->Surf).Flags.Info >> 0x2d & 1) == 0) << 0x1f);
      }
      else {
        pPlatform = (GMM_PLATFORM_INFO *)((ulong)pPlatform & 0xffffffff7fffffff);
      }
    }
    local_35 = (byte)((ulong)pPlatform >> 0x18) >> 7;
    pPlatform = (GMM_PLATFORM_INFO *)((ulong)pPlatform & 0xffffffffbfffffff);
    iVar1 = (*this->_vptr_GmmResourceInfoCommon[0x1e])();
    pGVar4 = Context::GetCachePolicyObj((Context *)CONCAT44(extraout_var_01,iVar1));
    uVar2 = (*pGVar4->_vptr_GmmCachePolicyCommon[5])
                      (pGVar4,0,(ulong)local_34,&local_35,
                       (ulong)(*(uint *)&(this->Surf).Flags.Info >> 2 & 1));
    OverrideData_local =
         (GMM_OVERRIDE_VALUES)
         ((ulong)pPlatform & 0xffffffff7fffffe0 | (ulong)(uVar2 & 0x1f) |
         (ulong)(-(local_35 & 1) & 1) << 0x1f);
  }
  return (uint64_t)OverrideData_local;
}

Assistant:

GMM_INLINE_VIRTUAL GMM_INLINE_EXPORTED uint64_t GMM_STDCALL GetDriverProtectionBits(GMM_OVERRIDE_VALUES OverrideData)
	    {
	        GMM_DRIVERPROTECTION     DriverProtection = {{0}};
	        const GMM_PLATFORM_INFO *pPlatform;
	        GMM_RESOURCE_USAGE_TYPE  Usage;

	        pPlatform = (GMM_PLATFORM_INFO *)GMM_OVERRIDE_EXPORTED_PLATFORM_INFO(&Surf, GetGmmLibContext());
	        if (GFX_GET_CURRENT_PRODUCT(pPlatform->Platform) < IGFX_PVC)
	        {
	            return 0;
	        }
	        Usage = Surf.CachePolicy.Usage;
	        if ((OverrideData.Usage > GMM_RESOURCE_USAGE_UNKNOWN) && (OverrideData.Usage < GMM_RESOURCE_USAGE_MAX)) 
	        {
	            Usage = (GMM_RESOURCE_USAGE_TYPE)OverrideData.Usage;
	        }
	        if (GetGmmLibContext()->GetSkuTable().FtrXe2Compression)
	        {
	            if (OverrideData.CompressionDis)
	            {
	                DriverProtection.CompressionEnReq = 0;
	            }
	            else
	            {

	                DriverProtection.CompressionEnReq = !Surf.Flags.Info.NotCompressed;
	            }
	        }

	        bool IscompressionEn              = DriverProtection.CompressionEnReq ? true : false;
	        DriverProtection.CacheableNoSnoop = false;

	        DriverProtection.PATIndex = GetGmmLibContext()->GetCachePolicyObj()->CachePolicyGetPATIndex(NULL, Usage, &IscompressionEn, (bool)(Surf.Flags.Info.Cacheable));

	        DriverProtection.CompressionEnReq = IscompressionEn ? true : false;

	        return DriverProtection.Value;
	    }